

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.h
# Opt level: O0

void __thiscall icu_63::RuleBasedBreakIterator::BreakCache::next(BreakCache *this)

{
  int32_t iVar1;
  BreakCache *this_local;
  
  if (this->fBufIdx == this->fEndBufIdx) {
    nextOL(this);
  }
  else {
    iVar1 = modChunkSize(this->fBufIdx + 1);
    this->fBufIdx = iVar1;
    iVar1 = this->fBoundaries[this->fBufIdx];
    this->fBI->fPosition = iVar1;
    this->fTextIdx = iVar1;
    this->fBI->fRuleStatusIndex = (uint)this->fStatuses[this->fBufIdx];
  }
  return;
}

Assistant:

void        next() {    if (fBufIdx == fEndBufIdx) {
                                nextOL();
                            } else {
                                fBufIdx = modChunkSize(fBufIdx + 1);
                                fTextIdx = fBI->fPosition = fBoundaries[fBufIdx];
                                fBI->fRuleStatusIndex = fStatuses[fBufIdx];
                            }
                }